

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

void xmlRegexpPrint(FILE *output,xmlRegexpPtr regexp)

{
  xmlRegAtomType xVar1;
  int iVar2;
  xmlRegAtomPtr pxVar3;
  xmlRegRangePtr pxVar4;
  xmlRegStatePtr pxVar5;
  xmlRegTrans *pxVar6;
  long lVar7;
  size_t sVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  if (output != (FILE *)0x0) {
    fwrite(" regexp: ",9,1,(FILE *)output);
    if (regexp == (xmlRegexpPtr)0x0) {
      fwrite("NULL\n",5,1,(FILE *)output);
      return;
    }
    fprintf((FILE *)output,"\'%s\' ",regexp->string);
    fputc(10,(FILE *)output);
    fprintf((FILE *)output,"%d atoms:\n",(ulong)(uint)regexp->nbAtoms);
    if (0 < regexp->nbAtoms) {
      uVar10 = 0;
      do {
        fprintf((FILE *)output," %02d ",uVar10 & 0xffffffff);
        pxVar3 = regexp->atoms[uVar10];
        fwrite(" atom: ",7,1,(FILE *)output);
        if (pxVar3 == (xmlRegAtomPtr)0x0) {
          fwrite("NULL\n",5,1,(FILE *)output);
        }
        else {
          if (pxVar3->neg != 0) {
            fwrite("not ",4,1,(FILE *)output);
          }
          xmlRegPrintAtomType(output,pxVar3->type);
          switch(pxVar3->quant) {
          case XML_REGEXP_QUANT_EPSILON:
            sVar8 = 8;
            pcVar9 = "epsilon ";
            break;
          case XML_REGEXP_QUANT_ONCE:
            sVar8 = 5;
            pcVar9 = "once ";
            break;
          case XML_REGEXP_QUANT_OPT:
            sVar8 = 2;
            pcVar9 = "? ";
            break;
          case XML_REGEXP_QUANT_MULT:
            sVar8 = 2;
            pcVar9 = "* ";
            break;
          case XML_REGEXP_QUANT_PLUS:
            sVar8 = 2;
            pcVar9 = "+ ";
            break;
          case XML_REGEXP_QUANT_ONCEONLY:
            sVar8 = 9;
            pcVar9 = "onceonly ";
            break;
          case XML_REGEXP_QUANT_ALL:
            sVar8 = 4;
            pcVar9 = "all ";
            break;
          case XML_REGEXP_QUANT_RANGE:
            sVar8 = 6;
            pcVar9 = "range ";
            break;
          default:
            goto switchD_0017bf5b_default;
          }
          fwrite(pcVar9,sVar8,1,(FILE *)output);
switchD_0017bf5b_default:
          if (pxVar3->quant == XML_REGEXP_QUANT_RANGE) {
            fprintf((FILE *)output,"%d-%d ",(ulong)(uint)pxVar3->min,(ulong)(uint)pxVar3->max);
          }
          if (pxVar3->type == XML_REGEXP_STRING) {
            fprintf((FILE *)output,"\'%s\' ",pxVar3->valuep);
          }
          xVar1 = pxVar3->type;
          if (xVar1 == XML_REGEXP_SUBREG) {
            fprintf((FILE *)output,"start %d end %d\n",(ulong)(uint)pxVar3->start->no,
                    (ulong)(uint)pxVar3->stop->no);
          }
          else if (xVar1 == XML_REGEXP_RANGES) {
            fprintf((FILE *)output,"%d entries\n",(ulong)(uint)pxVar3->nbRanges);
            if (0 < pxVar3->nbRanges) {
              lVar13 = 0;
              do {
                pxVar4 = pxVar3->ranges[lVar13];
                fwrite("  range: ",9,1,(FILE *)output);
                if (pxVar4->neg != 0) {
                  fwrite("negative ",9,1,(FILE *)output);
                }
                xmlRegPrintAtomType(output,pxVar4->type);
                fprintf((FILE *)output,"%c - %c\n",(ulong)(uint)pxVar4->start,
                        (ulong)(uint)pxVar4->end);
                lVar13 = lVar13 + 1;
              } while (lVar13 < pxVar3->nbRanges);
            }
          }
          else if (xVar1 == XML_REGEXP_CHARVAL) {
            fprintf((FILE *)output,"char %c\n",(ulong)(uint)pxVar3->codepoint);
          }
          else {
            fputc(10,(FILE *)output);
          }
        }
        uVar10 = uVar10 + 1;
      } while ((long)uVar10 < (long)regexp->nbAtoms);
    }
    fprintf((FILE *)output,"%d states:",(ulong)(uint)regexp->nbStates);
    fputc(10,(FILE *)output);
    if (0 < regexp->nbStates) {
      lVar13 = 0;
      do {
        pxVar5 = regexp->states[lVar13];
        fwrite(" state: ",8,1,(FILE *)output);
        if (pxVar5 == (xmlRegStatePtr)0x0) {
          fwrite("NULL\n",5,1,(FILE *)output);
        }
        else {
          if (pxVar5->type == XML_REGEXP_START_STATE) {
            fwrite("START ",6,1,(FILE *)output);
          }
          if (pxVar5->type == XML_REGEXP_FINAL_STATE) {
            fwrite("FINAL ",6,1,(FILE *)output);
          }
          fprintf((FILE *)output,"%d, %d transitions:\n",(ulong)(uint)pxVar5->no,
                  (ulong)(uint)pxVar5->nbTrans);
          if (0 < pxVar5->nbTrans) {
            lVar11 = 0;
            lVar12 = 0;
            do {
              pxVar6 = pxVar5->trans;
              fwrite("  trans: ",9,1,(FILE *)output);
              if (pxVar6 == (xmlRegTrans *)0x0) {
                sVar8 = 5;
                pcVar9 = "NULL\n";
LAB_0017c291:
                fwrite(pcVar9,sVar8,1,(FILE *)output);
              }
              else {
                if (*(int *)((long)&pxVar6->to + lVar11) < 0) {
                  sVar8 = 8;
                  pcVar9 = "removed\n";
                  goto LAB_0017c291;
                }
                iVar2 = *(int *)((long)&pxVar6->nd + lVar11);
                if (iVar2 != 0) {
                  if (iVar2 == 2) {
                    sVar8 = 0x16;
                    pcVar9 = "last not determinist, ";
                  }
                  else {
                    sVar8 = 0x11;
                    pcVar9 = "not determinist, ";
                  }
                  fwrite(pcVar9,sVar8,1,(FILE *)output);
                }
                if (-1 < *(int *)((long)&pxVar6->counter + lVar11)) {
                  fprintf((FILE *)output,"counted %d, ");
                }
                iVar2 = *(int *)((long)&pxVar6->count + lVar11);
                if (iVar2 == 0x123456) {
                  fwrite("all transition, ",0x10,1,(FILE *)output);
                }
                else if (-1 < iVar2) {
                  fprintf((FILE *)output,"count based %d, ");
                }
                lVar7 = *(long *)((long)&pxVar6->atom + lVar11);
                if (lVar7 == 0) {
                  fprintf((FILE *)output,"epsilon to %d\n",
                          (ulong)*(uint *)((long)&pxVar6->to + lVar11));
                }
                else {
                  if (*(int *)(lVar7 + 4) == 2) {
                    fprintf((FILE *)output,"char %c ",(ulong)*(uint *)(lVar7 + 0x2c));
                  }
                  fprintf((FILE *)output,"atom %d, to %d\n",
                          (ulong)**(uint **)((long)&pxVar6->atom + lVar11),
                          (ulong)*(uint *)((long)&pxVar6->to + lVar11));
                }
              }
              lVar12 = lVar12 + 1;
              lVar11 = lVar11 + 0x18;
            } while (lVar12 < pxVar5->nbTrans);
          }
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < regexp->nbStates);
    }
    fprintf((FILE *)output,"%d counters:\n",(ulong)(uint)regexp->nbCounters);
    if (0 < regexp->nbCounters) {
      uVar10 = 0;
      do {
        fprintf((FILE *)output," %d: min %d max %d\n",uVar10 & 0xffffffff,
                (ulong)(uint)regexp->counters[uVar10].min,(ulong)(uint)regexp->counters[uVar10].max)
        ;
        uVar10 = uVar10 + 1;
      } while ((long)uVar10 < (long)regexp->nbCounters);
    }
  }
  return;
}

Assistant:

void
xmlRegexpPrint(FILE *output, xmlRegexpPtr regexp) {
    int i;

    if (output == NULL)
        return;
    fprintf(output, " regexp: ");
    if (regexp == NULL) {
	fprintf(output, "NULL\n");
	return;
    }
    fprintf(output, "'%s' ", regexp->string);
    fprintf(output, "\n");
    fprintf(output, "%d atoms:\n", regexp->nbAtoms);
    for (i = 0;i < regexp->nbAtoms; i++) {
	fprintf(output, " %02d ", i);
	xmlRegPrintAtom(output, regexp->atoms[i]);
    }
    fprintf(output, "%d states:", regexp->nbStates);
    fprintf(output, "\n");
    for (i = 0;i < regexp->nbStates; i++) {
	xmlRegPrintState(output, regexp->states[i]);
    }
    fprintf(output, "%d counters:\n", regexp->nbCounters);
    for (i = 0;i < regexp->nbCounters; i++) {
	fprintf(output, " %d: min %d max %d\n", i, regexp->counters[i].min,
		                                regexp->counters[i].max);
    }
}